

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

void new_parsed_str(vm_val_t *ret,char *str,size_t len,int encmode)

{
  char *buf;
  char cVar1;
  byte bVar2;
  byte bVar3;
  CVmObjPageEntry *pCVar4;
  long lVar5;
  uint16_t tmp;
  vm_obj_id_t vVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  char *pcVar11;
  char *s1;
  char *pcVar12;
  
  vVar6 = CVmObjString::create(0,str,len);
  ret->typ = VM_OBJ;
  (ret->val).obj = vVar6;
  pCVar4 = G_obj_table_X.pages_[vVar6 >> 0xc];
  lVar5 = *(long *)((long)&pCVar4[vVar6 & 0xfff].ptr_ + 8);
  buf = (char *)(lVar5 + 2);
  pcVar9 = (char *)(len + lVar5 + 2);
  if (encmode - 1U < 2) {
    pcVar12 = buf;
    if (0 < (long)len) {
      pcVar11 = buf;
      do {
        cVar1 = *pcVar11;
        if ((((((cVar1 == '%') && (pcVar11 < (char *)(lVar5 + len))) &&
              (bVar2 = pcVar11[1], -1 < (char)bVar2)) &&
             ((0xfffffff5 < (int)(char)bVar2 - 0x3aU ||
              ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0))
              )))) && (bVar3 = pcVar11[2], -1 < (char)bVar3)) &&
           ((0xfffffff5 < (int)(char)bVar3 - 0x3aU ||
            ((bVar3 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) != 0))))
           )) {
          iVar8 = -0x37;
          iVar10 = -0x37;
          if ((char)bVar2 < 'A') {
            iVar10 = -0x30;
          }
          if ('`' < (char)bVar2) {
            iVar10 = -0x57;
          }
          if ((char)bVar3 < 'A') {
            iVar8 = -0x30;
          }
          if ('`' < (char)bVar3) {
            iVar8 = -0x57;
          }
          uVar7 = iVar8 + (char)bVar3 | (iVar10 + (char)bVar2) * 0x10;
          s1 = pcVar11 + 3;
          if ((uVar7 == 0xd) && (uVar7 = 0xd, pcVar11 + 5 < pcVar9)) {
            iVar8 = memicmp(s1,"%0a",3);
            if (iVar8 == 0) {
              s1 = pcVar11 + 6;
            }
            uVar7 = (uint)(iVar8 != 0) * 3 + 10;
          }
          *pcVar12 = (char)uVar7;
          pcVar12 = pcVar12 + 1;
        }
        else {
          if ((encmode - 1U < 2) && (cVar1 == '+')) {
            *pcVar12 = ' ';
            pcVar12 = pcVar12 + 1;
          }
          else if (cVar1 == '\r') {
            if (encmode != 2) {
LAB_00207c15:
              s1 = pcVar11 + 1;
              *pcVar12 = cVar1;
              pcVar12 = pcVar12 + 1;
              goto LAB_00207c1e;
            }
          }
          else if ((encmode != 2) || (cVar1 != '\n')) goto LAB_00207c15;
          s1 = pcVar11 + 1;
        }
LAB_00207c1e:
        pcVar11 = s1;
      } while (s1 < pcVar9);
    }
    pcVar9 = pcVar12;
    **(short **)((long)&pCVar4[vVar6 & 0xfff].ptr_ + 8) = (short)pcVar9 - (short)buf;
  }
  CCharmapToUni::validate(buf,(long)pcVar9 - (long)buf);
  return;
}

Assistant:

static void new_parsed_str(VMG_ vm_val_t *ret, const char *str, size_t len,
                           int encmode)
{
    char *src, *dst;

    /* create the raw string */
    ret->set_obj(CVmObjString::create(vmg_ FALSE, str, len));
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ ret->val.obj);

    /* get the string buffer */
    char *buf = s->cons_get_buf();
    char *bufend = buf + len;

    /* 
     *   if desired, decode url-encoding: run through the string, converting
     *   '%xx' sequences to bytes, and '+' characters to spaces
     */
    if (encmode == ENCMODE_URL || encmode == ENCMODE_FORM)
    {
        for (src = dst = buf ; src < bufend ; )
        {
            /* if this is a '%xx' sequence, convert it */
            if (*src == '%' && src + 2 < bufend
                && is_xdigit(*(src+1)) && is_xdigit(*(src+2)))
            {
                /* generate the character value */
                int c = (value_of_xdigit(*(src+1)) << 4)
                        | value_of_xdigit(*(src+2));

                /* skip the three-character %xx sequence */
                src += 3;

                /* 
                 *   if this is an encoded CR, and an LF follows, decode the
                 *   whole sequence to a single '\n' 
                 */
                if (c == '\r'
                    && src + 2 < bufend
                    && memicmp(src, "%0a", 3) == 0)
                {
                    /* change to '\n' */
                    c = '\n';

                    /* skip the in the source */
                    src += 3;
                }
                
                /* set the character in the output */
                *dst++ = (char)(unsigned char)c;
            }
            else if (*src == '+'
                     && (encmode == ENCMODE_FORM || encmode == ENCMODE_URL))
            {
                /* for form data, translate + to space */
                *dst++ = ' ';
                ++src;
            }
            else if ((*src == '\r' || *src == '\n')
                     && encmode == ENCMODE_FORM)
            {
                /* for form data, strip out newlines */
                ++src;
            }
            else
            {
                /* ordinary character - copy as-is */
                *dst++ = *src++;
            }
        }
        
        /* 
         *   update the length - the string might have contracted, since
         *   '%xx' sequences might have turned into single bytes 
         */
        len = dst - buf;
        bufend = dst;
        s->cons_set_len(len);
    }
    else if (encmode == ENCMODE_MIME)
    {
        // $$$ decode the MIME ?= encoding
    }

    /* ensure that the buffer has only well-formed UTF-8 characters */
    CCharmapToUni::validate(buf, bufend - buf);
}